

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.h
# Opt level: O2

int CG<TPZMatrix<long_double>,TPZFMatrix<long_double>,TPZMatrixSolver<long_double>,double>
              (TPZMatrix<long_double> *A,TPZFMatrix<long_double> *x,TPZFMatrix<long_double> *b,
              TPZMatrixSolver<long_double> *M,TPZFMatrix<long_double> *residual,int64_t *max_iter,
              double *tol,int FromCurrent)

{
  double dVar1;
  ostream *poVar2;
  int iVar3;
  long lVar4;
  TPZFMatrix<long_double> *pTVar5;
  TPZFMatrix<long_double> *pTVar6;
  longdouble in_ST0;
  longdouble lVar7;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar8;
  longdouble lVar9;
  longdouble in_ST6;
  longdouble in_ST7;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  TPZFMatrix<long_double> q;
  TPZFMatrix<long_double> z;
  TPZFMatrix<long_double> p;
  TPZFMatrix<long_double> resbackup;
  
  pTVar5 = x;
  TPZFMatrix<long_double>::TPZFMatrix(&p);
  TPZFMatrix<long_double>::TPZFMatrix(&z);
  TPZFMatrix<long_double>::TPZFMatrix(&q);
  Norm((longdouble *)b,pTVar5);
  TPZFMatrix<long_double>::TPZFMatrix(&resbackup);
  pTVar5 = &resbackup;
  if (residual != (TPZFMatrix<long_double> *)0x0) {
    pTVar5 = residual;
  }
  if (FromCurrent == 0) {
    (*(x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              ();
    TPZFMatrix<long_double>::operator=(pTVar5,b);
  }
  else {
    pTVar6 = x;
    in_ST7 = in_ST6;
    (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x27])(A,x,b,pTVar5,0);
    b = pTVar6;
  }
  lVar8 = in_ST7;
  Norm((longdouble *)pTVar5,b);
  uVar10 = -(ulong)((double)in_ST0 == 0.0);
  dVar12 = (double)(~uVar10 & (ulong)(double)in_ST0 | uVar10 & 0x3ff0000000000000);
  dVar13 = (double)in_ST1 / dVar12;
  if (dVar13 <= *tol) {
    lVar4 = 0;
LAB_00cfd3d8:
    iVar3 = 0;
    *tol = dVar13;
    *max_iter = lVar4;
  }
  else {
    dVar11 = 0.0;
    for (lVar4 = 1; lVar4 <= *max_iter; lVar4 = lVar4 + 1) {
      (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,pTVar5,&z,0);
      lVar9 = lVar8;
      Dot<long_double>(pTVar5,&z);
      dVar1 = (double)in_ST2;
      if (lVar4 == 1) {
        TPZFMatrix<long_double>::operator=(&p,&z);
        lVar7 = in_ST4;
        in_ST2 = in_ST5;
        in_ST4 = in_ST7;
        in_ST5 = lVar8;
      }
      else {
        TPZFMatrix<long_double>::TimesBetaPlusZ(&p,(longdouble)(dVar1 / dVar11),&z);
        lVar7 = in_ST4;
        in_ST2 = in_ST5;
        in_ST4 = in_ST7;
        in_ST5 = lVar8;
      }
      (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])(A,&p,&q);
      in_ST7 = lVar9;
      Dot<long_double>(&p,&q);
      TPZFMatrix<long_double>::ZAXPY(x,(longdouble)(dVar1 / (double)in_ST3),&p);
      pTVar6 = &q;
      TPZFMatrix<long_double>::ZAXPY(pTVar5,(longdouble)-(dVar1 / (double)in_ST3),&q);
      in_ST3 = in_ST6;
      in_ST6 = lVar9;
      lVar8 = in_ST7;
      Norm((longdouble *)pTVar5,pTVar6);
      dVar13 = (double)lVar7 / dVar12;
      if (dVar13 <= *tol) goto LAB_00cfd3d8;
      dVar11 = dVar1;
    }
    *tol = dVar13;
    poVar2 = std::operator<<((ostream *)&std::cout,"cg iter = ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::operator<<(poVar2," res = ");
    poVar2 = std::ostream::_M_insert<double>(dVar13);
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar3 = 1;
  }
  TPZFMatrix<long_double>::~TPZFMatrix(&resbackup);
  TPZFMatrix<long_double>::~TPZFMatrix(&q);
  TPZFMatrix<long_double>::~TPZFMatrix(&z);
  TPZFMatrix<long_double>::~TPZFMatrix(&p);
  return iVar3;
}

Assistant:

int
CG( Matrix &A, Vector &x, const Vector &b,
   Preconditioner &M, Vector *residual, int64_t &max_iter, Real &tol,const int FromCurrent)
{
	Real resid;
	Vector p, z, q;
	REAL alpha, beta, rho, rho_1 = 0;
	
    REAL normb = TPZExtractVal::val(Norm(b));
	Vector resbackup;
	Vector *res = residual;
	
#ifdef TEST
	std::list< TPZFMatrix<REAL> > plist,qlist;
	std::list< TPZFMatrix<REAL> >::iterator jt;
	std::list< TPZFMatrix<REAL> >::iterator kt;
	Vector Au;
#endif
	
	if(!res) res = &resbackup;
	Vector &r = *res;
	//  Vector r = b - A*x;
	if(FromCurrent) 
    {
        A.MultAdd(x,b,r,-1.,1.);
    }
	else {
		x.Zero();
		r = b;
	}
	
	if (normb == 0.0)
		normb = 1.0;
	
    if ((resid = (TPZExtractVal::val( Norm(r) ) ) / normb) <= tol) {
		tol = resid;
		max_iter = 0;
		return 0;
	}
	int64_t i;
	for (i = 1; i <= max_iter; i++) {
		M.Solve(r,z);
        rho = TPZExtractVal::val(Dot(r, z));
		
		if (i == 1)
			p = z;
		else {
			beta = rho / rho_1;
			p.TimesBetaPlusZ(beta,z);
		}
#ifdef TEST
		
		plist.push_back(p);
#endif	 
		
		A.Multiply(p,q);
		alpha = rho / (TPZExtractVal::val(Dot(p, q)));
		
#ifdef TEST
		qlist.push_back(q);
#endif
		
		x.ZAXPY(alpha,p);
		r.ZAXPY(-alpha,q);
		
#ifdef TEST
		A.Multiply(x,Au);
		REAL energy = Dot(x,Au)/2.-Dot(x,b);
#endif
		
		if ((resid = (TPZExtractVal::val(Norm(r))) / normb) <= tol) {
			tol = resid;
			max_iter = i;
#ifdef PZDEBUG
			std::cout << "cg iter = " << i <<  " res = " << resid << std::endl;
#endif
			return 0;
		}
#ifdef PZDEBUG
		std::cout << "cg iter = " << i <<  " res = " << resid /*<< " energy " << energy */ << std::endl;
#endif
#ifdef TEST
		std::cout << " energy " << energy << std::endl;
		TPZFMatrix<REAL> inner(plist.size(),plist.size(),0.);
		{
			int64_t j,k;
			for(j=0, jt = plist.begin(); jt != plist.end(); jt++,j++)
			{
				for(k=0, kt = qlist.begin(); kt != qlist.end(); kt++,k++)
				{
					inner(j,k) = Dot((*jt),(*kt));
				}
			}
		}
		inner.Print("Inner product of search directions");
#endif
		rho_1 = rho;
	}
	
	tol = resid;
	std::cout << "cg iter = " << i <<  " res = " << resid << std::endl;
	return 1;
}